

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_sectionstyle.cpp
# Opt level: O0

void __thiscall ON_SectionStyle::SetBoundaryVisible(ON_SectionStyle *this,bool on)

{
  bool bVar1;
  ON_SectionStylePrivate *this_00;
  bool on_local;
  ON_SectionStyle *this_local;
  
  bVar1 = BoundaryVisible(this);
  if (bVar1 != on) {
    if (this->m_private == (ON_SectionStylePrivate *)0x0) {
      this_00 = (ON_SectionStylePrivate *)operator_new(0x50);
      memset(this_00,0,0x50);
      ON_SectionStylePrivate::ON_SectionStylePrivate(this_00);
      this->m_private = this_00;
    }
    this->m_private->m_boundary_visible = on;
  }
  return;
}

Assistant:

void ON_SectionStyle::SetBoundaryVisible(bool on)
{
  if (BoundaryVisible() == on)
    return;
  if (nullptr == m_private)
    m_private = new ON_SectionStylePrivate();
  m_private->m_boundary_visible = on;
}